

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngpread.c
# Opt level: O0

void png_push_read_IDAT(png_structrp png_ptr)

{
  png_uint_32 pVar1;
  uint local_34;
  ulong uStack_30;
  png_uint_32 idat_size_1;
  size_t save_size_1;
  ulong uStack_20;
  png_uint_32 idat_size;
  size_t save_size;
  png_byte chunk_tag [4];
  png_byte chunk_length [4];
  png_structrp png_ptr_local;
  
  _chunk_tag = png_ptr;
  if ((png_ptr->mode & 0x100) == 0) {
    if (png_ptr->buffer_size < 8) {
      png_push_save_buffer(png_ptr);
      return;
    }
    png_push_fill_buffer(png_ptr,(png_bytep)((long)&save_size + 4),4);
    pVar1 = png_get_uint_31(_chunk_tag,(png_const_bytep)((long)&save_size + 4));
    _chunk_tag->push_length = pVar1;
    png_reset_crc(_chunk_tag);
    png_crc_read(_chunk_tag,(png_bytep)&save_size,4);
    _chunk_tag->chunk_name =
         (uint)(byte)save_size << 0x18 | (uint)save_size._1_1_ << 0x10 | (uint)save_size._2_1_ << 8
         | (uint)save_size._3_1_;
    _chunk_tag->mode = _chunk_tag->mode | 0x100;
    if (_chunk_tag->chunk_name != 0x49444154) {
      _chunk_tag->process_mode = 1;
      if ((_chunk_tag->flags & 8) != 0) {
        return;
      }
      png_error(_chunk_tag,"Not enough compressed data");
    }
    _chunk_tag->idat_size = _chunk_tag->push_length;
  }
  if ((_chunk_tag->idat_size != 0) && (_chunk_tag->save_buffer_size != 0)) {
    uStack_20 = _chunk_tag->save_buffer_size;
    save_size_1._4_4_ = _chunk_tag->idat_size;
    if (save_size_1._4_4_ < uStack_20) {
      uStack_20 = (ulong)save_size_1._4_4_;
    }
    else {
      save_size_1._4_4_ = (uint)uStack_20;
    }
    png_calculate_crc(_chunk_tag,_chunk_tag->save_buffer_ptr,uStack_20);
    png_process_IDAT_data(_chunk_tag,_chunk_tag->save_buffer_ptr,uStack_20);
    _chunk_tag->idat_size = _chunk_tag->idat_size - save_size_1._4_4_;
    _chunk_tag->buffer_size = _chunk_tag->buffer_size - uStack_20;
    _chunk_tag->save_buffer_size = _chunk_tag->save_buffer_size - uStack_20;
    _chunk_tag->save_buffer_ptr = _chunk_tag->save_buffer_ptr + uStack_20;
  }
  if ((_chunk_tag->idat_size != 0) && (_chunk_tag->current_buffer_size != 0)) {
    uStack_30 = _chunk_tag->current_buffer_size;
    local_34 = _chunk_tag->idat_size;
    if (local_34 < uStack_30) {
      uStack_30 = (ulong)local_34;
    }
    else {
      local_34 = (uint)uStack_30;
    }
    png_calculate_crc(_chunk_tag,_chunk_tag->current_buffer_ptr,uStack_30);
    png_process_IDAT_data(_chunk_tag,_chunk_tag->current_buffer_ptr,uStack_30);
    _chunk_tag->idat_size = _chunk_tag->idat_size - local_34;
    _chunk_tag->buffer_size = _chunk_tag->buffer_size - uStack_30;
    _chunk_tag->current_buffer_size = _chunk_tag->current_buffer_size - uStack_30;
    _chunk_tag->current_buffer_ptr = _chunk_tag->current_buffer_ptr + uStack_30;
  }
  if (_chunk_tag->idat_size == 0) {
    if (_chunk_tag->buffer_size < 4) {
      png_push_save_buffer(_chunk_tag);
    }
    else {
      png_crc_finish(_chunk_tag,0);
      _chunk_tag->mode = _chunk_tag->mode & 0xfffffeff;
      _chunk_tag->mode = _chunk_tag->mode | 8;
      _chunk_tag->zowner = 0;
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_push_read_IDAT(png_structrp png_ptr)
{
   if ((png_ptr->mode & PNG_HAVE_CHUNK_HEADER) == 0)
   {
      png_byte chunk_length[4];
      png_byte chunk_tag[4];

      /* TODO: this code can be commoned up with the same code in push_read */
      PNG_PUSH_SAVE_BUFFER_IF_LT(8)
      png_push_fill_buffer(png_ptr, chunk_length, 4);
      png_ptr->push_length = png_get_uint_31(png_ptr, chunk_length);
      png_reset_crc(png_ptr);
      png_crc_read(png_ptr, chunk_tag, 4);
      png_ptr->chunk_name = PNG_CHUNK_FROM_STRING(chunk_tag);
      png_ptr->mode |= PNG_HAVE_CHUNK_HEADER;

      if (png_ptr->chunk_name != png_IDAT)
      {
         png_ptr->process_mode = PNG_READ_CHUNK_MODE;

         if ((png_ptr->flags & PNG_FLAG_ZSTREAM_ENDED) == 0)
            png_error(png_ptr, "Not enough compressed data");

         return;
      }

      png_ptr->idat_size = png_ptr->push_length;
   }

   if (png_ptr->idat_size != 0 && png_ptr->save_buffer_size != 0)
   {
      size_t save_size = png_ptr->save_buffer_size;
      png_uint_32 idat_size = png_ptr->idat_size;

      /* We want the smaller of 'idat_size' and 'current_buffer_size', but they
       * are of different types and we don't know which variable has the fewest
       * bits.  Carefully select the smaller and cast it to the type of the
       * larger - this cannot overflow.  Do not cast in the following test - it
       * will break on either 16-bit or 64-bit platforms.
       */
      if (idat_size < save_size)
         save_size = (size_t)idat_size;

      else
         idat_size = (png_uint_32)save_size;

      png_calculate_crc(png_ptr, png_ptr->save_buffer_ptr, save_size);

      png_process_IDAT_data(png_ptr, png_ptr->save_buffer_ptr, save_size);

      png_ptr->idat_size -= idat_size;
      png_ptr->buffer_size -= save_size;
      png_ptr->save_buffer_size -= save_size;
      png_ptr->save_buffer_ptr += save_size;
   }

   if (png_ptr->idat_size != 0 && png_ptr->current_buffer_size != 0)
   {
      size_t save_size = png_ptr->current_buffer_size;
      png_uint_32 idat_size = png_ptr->idat_size;

      /* We want the smaller of 'idat_size' and 'current_buffer_size', but they
       * are of different types and we don't know which variable has the fewest
       * bits.  Carefully select the smaller and cast it to the type of the
       * larger - this cannot overflow.
       */
      if (idat_size < save_size)
         save_size = (size_t)idat_size;

      else
         idat_size = (png_uint_32)save_size;

      png_calculate_crc(png_ptr, png_ptr->current_buffer_ptr, save_size);

      png_process_IDAT_data(png_ptr, png_ptr->current_buffer_ptr, save_size);

      png_ptr->idat_size -= idat_size;
      png_ptr->buffer_size -= save_size;
      png_ptr->current_buffer_size -= save_size;
      png_ptr->current_buffer_ptr += save_size;
   }

   if (png_ptr->idat_size == 0)
   {
      PNG_PUSH_SAVE_BUFFER_IF_LT(4)
      png_crc_finish(png_ptr, 0);
      png_ptr->mode &= ~PNG_HAVE_CHUNK_HEADER;
      png_ptr->mode |= PNG_AFTER_IDAT;
      png_ptr->zowner = 0;
   }
}